

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::LogFreeSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *this,SegmentBase<Memory::VirtualAllocWrapper> *segment)

{
  size_t sVar1;
  PageMemoryData *pPVar2;
  
  sVar1 = segment->segmentPageCount;
  this->committedBytes = this->committedBytes + sVar1 * -0x1000;
  this->reservedBytes = this->reservedBytes + sVar1 * -0x1000;
  this->numberOfSegments = this->numberOfSegments - 1;
  pPVar2 = this->memoryData;
  if (pPVar2 != (PageMemoryData *)0x0) {
    pPVar2->releaseSegmentCount = pPVar2->releaseSegmentCount + 1;
    pPVar2->releaseSegmentBytes = pPVar2->releaseSegmentBytes + sVar1 * 0x1000;
    pPVar2->currentCommittedPageCount = pPVar2->currentCommittedPageCount - sVar1;
  }
  return;
}

Assistant:

size_t GetPageCount() const { return segmentPageCount; }